

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterhash.h
# Opt level: O2

void __thiscall
CharacterHash<unsigned_long_long,_unsigned_char>::CharacterHash
          (CharacterHash<unsigned_long_long,_unsigned_char> *this,unsigned_long_long maxval)

{
  uint32_conflict uVar1;
  uint32_conflict uVar2;
  size_t k;
  unsigned_long_long uVar3;
  long lVar4;
  mersenneRNG randomgeneratorbase;
  mersenneRNG randomgenerator;
  mersenneRNG mStack_2758;
  mersenneRNG local_13c0;
  
  MTRand::seed(&local_13c0.mtr);
  local_13c0.n = (int)(maxval >> 0x20);
  uVar3 = 0xffffffff;
  if (maxval < 0xffffffff) {
    uVar3 = maxval;
  }
  MTRand::seed(&mStack_2758.mtr);
  mStack_2758.n = (int)uVar3;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    uVar1 = mersenneRNG::operator()(&mStack_2758);
    uVar2 = mersenneRNG::operator()(&local_13c0);
    this->hashvalues[lVar4] = CONCAT44(uVar2,uVar1);
  }
  return;
}

Assistant:

CharacterHash(hashvaluetype maxval) {
    if (sizeof(hashvaluetype) <= 4) {
      mersenneRNG randomgenerator(maxval);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgenerator());
    } else if (sizeof(hashvaluetype) == 8) {
      mersenneRNG randomgenerator(maxval >> 32);
      mersenneRNG randomgeneratorbase((maxval >> 32) == 0 ? maxval
                                                          : 0xFFFFFFFFU);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgeneratorbase()) |
                        (static_cast<hashvaluetype>(randomgenerator()) << 32);
    } else
      throw runtime_error("unsupported hash value type");
  }